

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbr2_misc.cc
# Opt level: O0

bool __thiscall
quic::Bbr2NetworkModel::MaybeExpireMinRtt
          (Bbr2NetworkModel *this,Bbr2CongestionEvent *congestion_event)

{
  QuicTime lhs;
  bool bVar1;
  QuicTime QVar2;
  Bbr2Params *pBVar3;
  Bbr2CongestionEvent *congestion_event_local;
  Bbr2NetworkModel *this_local;
  
  lhs.time_ = (congestion_event->event_time).time_;
  QVar2 = MinRttTimestamp(this);
  pBVar3 = Params(this);
  QVar2 = operator+(QVar2,(pBVar3->probe_rtt_period).time_offset_);
  bVar1 = operator<(lhs,QVar2);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = QuicTime::Delta::IsInfinite(&congestion_event->sample_min_rtt);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      MinRttFilter::ForceUpdate
                (&this->min_rtt_filter_,(Delta)(congestion_event->sample_min_rtt).time_offset_,
                 (QuicTime)(congestion_event->event_time).time_);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Bbr2NetworkModel::MaybeExpireMinRtt(
    const Bbr2CongestionEvent& congestion_event) {
  if (congestion_event.event_time <
      (MinRttTimestamp() + Params().probe_rtt_period)) {
    return false;
  }
  if (congestion_event.sample_min_rtt.IsInfinite()) {
    return false;
  }
  //QUIC_DVLOG(3) << "Replacing expired min rtt of " << min_rtt_filter_.Get()
  //              << " by " << congestion_event.sample_min_rtt << "  @ "
  //              << congestion_event.event_time;
  min_rtt_filter_.ForceUpdate(congestion_event.sample_min_rtt,
                              congestion_event.event_time);
  return true;
}